

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::WriteAmpEnableAxis(AmpIO *this,uint index,bool state)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  
  if (index < this->NumMotors) {
    uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    if (uVar2 < 8) {
      if (pBVar1 != (BasePort *)0x0) {
        iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0,
                           (ulong)((state | 0x100) << ((byte)index & 0x1f)),
                           pBVar1->_vptr_BasePort[0x24]);
        return SUB41(iVar3,0);
      }
    }
    else if (pBVar1 != (BasePort *)0x0) {
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)(index * 0x10 + 0x11),(ulong)((state | 2) << 0x1c));
      return SUB41(iVar3,0);
    }
  }
  return false;
}

Assistant:

bool AmpIO::WriteAmpEnableAxis(unsigned int index, bool state)
{
    if (index >= NumMotors)
        return false;

    if (GetFirmwareVersion() < 8) {
        quadlet_t mask = (1 << index);
        quadlet_t write_data = (mask << 8);
        if (state) write_data |= mask;
        return (port ? port->WriteQuadlet(BoardId, BoardIO::BOARD_STATUS, write_data) : false);
    }
    else {
        quadlet_t write_data = MOTOR_ENABLE_MASK;
        if (state)
            write_data |=  MOTOR_ENABLE_BIT;
        unsigned int channel = (index+1) << 4;
        return (port ? port->WriteQuadlet(BoardId, channel | DAC_CTRL_REG, write_data) : false);
    }
}